

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_directory.cpp
# Opt level: O1

FResourceFile * CheckDir(char *filename,FileReader *file,bool quiet)

{
  int iVar1;
  FDirectory *this;
  
  this = (FDirectory *)operator_new(0x30);
  FDirectory::FDirectory(this,filename);
  iVar1 = (*(this->super_FResourceFile)._vptr_FResourceFile[3])(this,(ulong)quiet);
  if ((char)iVar1 == '\0') {
    (*(this->super_FResourceFile)._vptr_FResourceFile[1])(this);
    this = (FDirectory *)0x0;
  }
  return &this->super_FResourceFile;
}

Assistant:

FResourceFile *CheckDir(const char *filename, FileReader *file, bool quiet)
{
	FResourceFile *rf = new FDirectory(filename);
	if (rf->Open(quiet)) return rf;
	delete rf;
	return NULL;
}